

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

unique_pointer<const_void> __thiscall
pstore::database::getu(database *this,address addr,size_t size,bool initialized)

{
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var1;
  undefined7 in_register_00000009;
  size_t size_00;
  void *extraout_RDX;
  unique_pointer<const_void> uVar3;
  _Head_base<0UL,_const_void_*,_false> _Var2;
  
  size_00 = CONCAT71(in_register_00000009,initialized);
  check_get_params((database *)addr.a_,(address)size,size_00,false);
  if (size_00 != 0) {
    if (size_00 + size == 0) {
      assert_failed("lhs.absolute () >= rhs",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/address.hpp"
                    ,0xca);
    }
    _Var1._M_head_impl =
         (((storage *)(addr.a_ + 8))->sat_)._M_t.
         super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
    if (*(long *)((long)(_Var1._M_head_impl)->_M_elems +
                 (ulong)(((uint)(size >> 0x16) & 0xffff) << 5) + 0x10) !=
        *(long *)((long)(_Var1._M_head_impl)->_M_elems +
                 (ulong)(((uint)((size_00 + size) - 1 >> 0x16) & 0xffff) << 5) + 0x10)) {
      uVar3 = get_spanningu(this,addr,size,initialized);
      _Var2._M_head_impl =
           uVar3._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
           super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
           super__Head_base<0UL,_const_void_*,_false>._M_head_impl;
      goto LAB_001f48c4;
    }
  }
  _Var1._M_head_impl =
       (array<pstore::sat_entry,_65536UL> *)
       storage::address_to_raw_pointer((storage *)(addr.a_ + 8),(address)size);
  this->_vptr_database = (_func_int **)deleter_nop<void_const>;
  (this->storage_).sat_._M_t.
  super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       _Var1._M_head_impl;
  _Var2._M_head_impl = extraout_RDX;
LAB_001f48c4:
  uVar3._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
  super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
  super__Head_base<0UL,_const_void_*,_false>._M_head_impl = _Var2._M_head_impl;
  uVar3._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
  super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>.
  super__Tuple_impl<1UL,_void_(*)(const_void_*)>.
  super__Head_base<1UL,_void_(*)(const_void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(const_void_*),_false>)
       (_Head_base<1UL,_void_(*)(const_void_*),_false>)this;
  return (unique_pointer<const_void>)
         uVar3._M_t.super___uniq_ptr_impl<const_void,_void_(*)(const_void_*)>._M_t.
         super__Tuple_impl<0UL,_const_void_*,_void_(*)(const_void_*)>;
}

Assistant:

auto database::getu (address addr, std::size_t size, bool initialized) const
        -> unique_pointer<void const> {
        this->check_get_params (addr, size, false);
        if (storage_.request_spans_regions (addr, size)) {
            return this->get_spanningu (addr, size, initialized);
        }
        return {storage_.address_to_raw_pointer (addr), deleter_nop<void const>};
    }